

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::ParseErrorCatcher::ParseErrorCatcher
          (ParseErrorCatcher *this,ProcessContext *context)

{
  ProcessContext *context_local;
  ParseErrorCatcher *this_local;
  
  kj::ExceptionCallback::ExceptionCallback(&this->super_ExceptionCallback);
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__ParseErrorCatcher_004c16a8;
  this->context = context;
  kj::Maybe<kj::Exception>::Maybe(&this->exception);
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

ParseErrorCatcher(kj::ProcessContext& context): context(context) {}